

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall ExpressionContext::AddType(ExpressionContext *this,TypeBase *type)

{
  uint uVar1;
  ScopeData *pSVar2;
  TypeLookupResult local_40;
  TypeLookupResult local_30;
  TypeClass *local_20;
  TypeClass *typeClass;
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  typeClass = (TypeClass *)type;
  type_local = (TypeBase *)this;
  SmallArray<TypeBase_*,_2U>::push_back(&this->scope->types,(TypeBase **)&typeClass);
  SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&typeClass);
  local_20 = getType<TypeClass>((TypeBase *)typeClass);
  if ((local_20 == (TypeClass *)0x0) || ((local_20->isInternal & 1U) == 0)) {
    if (this->scope->type == SCOPE_NAMESPACE) {
      pSVar2 = this->globalScope;
      uVar1 = (typeClass->super_TypeStruct).super_TypeBase.nameHash;
      TypeLookupResult::TypeLookupResult(&local_30,(TypeBase *)typeClass);
      DirectChainedMap<TypeLookupResult>::insert(&pSVar2->typeLookupMap,uVar1,local_30);
    }
    else {
      pSVar2 = this->scope;
      uVar1 = (typeClass->super_TypeStruct).super_TypeBase.nameHash;
      TypeLookupResult::TypeLookupResult(&local_40,(TypeBase *)typeClass);
      DirectChainedMap<TypeLookupResult>::insert(&pSVar2->typeLookupMap,uVar1,local_40);
    }
  }
  return;
}

Assistant:

void ExpressionContext::AddType(TypeBase *type)
{
	scope->types.push_back(type);

	types.push_back(type);

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->isInternal)
			return;
	}

	// Namespaces are allowed only in global scope and namespaced type names are globally accessible through namespace name
	if(scope->type == SCOPE_NAMESPACE)
		globalScope->typeLookupMap.insert(type->nameHash, TypeLookupResult(type));
	else
		scope->typeLookupMap.insert(type->nameHash, TypeLookupResult(type));
}